

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O0

UBool icu_63::PatternProps::isIdentifier(UChar *s,int32_t length)

{
  UBool UVar1;
  UChar *pUVar2;
  UChar *limit;
  UChar *pUStack_18;
  int32_t length_local;
  UChar *s_local;
  
  if (length < 1) {
    s_local._7_1_ = '\0';
  }
  else {
    pUStack_18 = s;
    do {
      pUVar2 = pUStack_18 + 1;
      UVar1 = isSyntaxOrWhiteSpace((uint)(ushort)*pUStack_18);
      if (UVar1 != '\0') {
        return '\0';
      }
      pUStack_18 = pUVar2;
    } while (pUVar2 < s + length);
    s_local._7_1_ = '\x01';
  }
  return s_local._7_1_;
}

Assistant:

UBool
PatternProps::isIdentifier(const UChar *s, int32_t length) {
    if(length<=0) {
        return FALSE;
    }
    const UChar *limit=s+length;
    do {
        if(isSyntaxOrWhiteSpace(*s++)) {
            return FALSE;
        }
    } while(s<limit);
    return TRUE;
}